

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSweep.c
# Opt level: O1

Gia_Man_t *
Gia_ManSweepWithBoxes
          (Gia_Man_t *p,void *pParsC,void *pParsS,int fConst,int fEquiv,int fVerbose,int fVerbEquivs
          )

{
  ulong uVar1;
  uint uVar2;
  int iVar3;
  Gia_Man_t *pGVar4;
  long lVar5;
  Gia_Man_t *pGVar6;
  int *pReprs;
  Gia_Man_t *p_00;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  undefined8 local_50;
  uint local_48;
  int local_44;
  int local_40;
  int local_3c;
  Cec_ParCor_t *local_38;
  
  local_48 = 0;
  local_50 = 0;
  if (p->nRegs != 0) {
    __assert_fail("Gia_ManRegNum(p) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSweep.c"
                  ,0x2d1,
                  "Gia_Man_t *Gia_ManSweepWithBoxes(Gia_Man_t *, void *, void *, int, int, int, int)"
                 );
  }
  local_38 = (Cec_ParCor_t *)pParsS;
  if (p->pAigExtra == (Gia_Man_t *)0x0) {
    __assert_fail("p->pAigExtra != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSweep.c"
                  ,0x2d2,
                  "Gia_Man_t *Gia_ManSweepWithBoxes(Gia_Man_t *, void *, void *, int, int, int, int)"
                 );
  }
  if ((pParsC == (void *)0x0) && (iVar3 = Gia_ManClockDomainNum(p), 1 < iVar3)) {
    pGVar4 = Gia_ManSweepWithBoxesAndDomains(p,local_38,fConst,fEquiv,fVerbose,fVerbEquivs);
    return pGVar4;
  }
  local_44 = fConst;
  local_40 = fEquiv;
  pGVar4 = Gia_ManDupUnnormalize(p);
  p_00 = (Gia_Man_t *)0x0;
  if (pGVar4 != (Gia_Man_t *)0x0) {
    local_3c = fVerbEquivs;
    Gia_ManTransferTiming(pGVar4,p);
    lVar5 = (long)pGVar4->vRegClasses->nSize;
    if (0 < lVar5) {
      lVar8 = 0;
      p_00 = (Gia_Man_t *)0x0;
      do {
        p_00 = (Gia_Man_t *)(ulong)((int)p_00 + (uint)(pGVar4->vRegClasses->pArray[lVar8] == 1));
        lVar8 = lVar8 + 1;
      } while (lVar5 != lVar8);
    }
    pGVar6 = Gia_ManDupCollapse(pGVar4,pGVar4->pAigExtra,(Vec_Int_t *)0x0,
                                (uint)(pParsC == (void *)0x0));
    if (pParsC == (void *)0x0) {
      if (local_38 == (Cec_ParCor_t *)0x0) {
        Gia_ManSeqCleanupClasses(pGVar6,local_44,local_40,fVerbose);
      }
      else {
        Cec_ManLSCorrespondenceClasses(pGVar6,local_38);
      }
    }
    else {
      Gia_ManFraigSweepPerform(pGVar6,pParsC);
    }
    pReprs = Gia_ManFraigSelectReprs(pGVar4,pGVar6,fVerbose,(int *)&local_50);
    Gia_ManStop(pGVar6);
    Gia_ManTransferTiming(p,pGVar4);
    pGVar6 = Gia_ManFraigReduceGia(pGVar4,pReprs);
    Gia_ManTransferTiming(pGVar6,p);
    Gia_ManStop(pGVar4);
    if (pReprs != (int *)0x0) {
      free(pReprs);
    }
    pGVar4 = Gia_ManDupWithBoxes(pGVar6,(uint)(pParsC == (void *)0x0));
    Gia_ManStop(pGVar6);
    uVar1 = local_50;
    lVar5 = (long)pGVar4->vRegClasses->nSize;
    if (lVar5 < 1) {
      iVar3 = 0;
    }
    else {
      lVar8 = 0;
      iVar3 = 0;
      do {
        iVar3 = iVar3 + (uint)(pGVar4->vRegClasses->pArray[lVar8] == 1);
        lVar8 = lVar8 + 1;
      } while (lVar5 != lVar8);
    }
    uVar2 = local_50._4_4_;
    uVar9 = (int)p_00 - ((int)local_50 + local_50._4_4_ + iVar3);
    local_48 = uVar9;
    if (local_3c != 0) {
      printf("Domain %2d : %5d -> %5d :  ",1,p_00);
      uVar7 = 0;
      if (0 < (int)uVar9) {
        uVar7 = (ulong)uVar9;
      }
      uVar10 = -uVar9;
      if (-1 < (int)uVar9) {
        uVar10 = 0;
      }
      printf("EqConst =%4d.  EqFlop =%4d.  Dangling =%4d.  Unused =%4d.\n",uVar1 & 0xffffffff,
             (ulong)uVar2,uVar7,(ulong)uVar10);
    }
    p_00 = Gia_ManDupNormalize(pGVar4,0);
    Gia_ManTransferTiming(p_00,pGVar4);
    Gia_ManStop(pGVar4);
  }
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManSweepWithBoxes( Gia_Man_t * p, void * pParsC, void * pParsS, int fConst, int fEquiv, int fVerbose, int fVerbEquivs )
{ 
    Gia_Man_t * pClp, * pNew, * pTemp;
    int * pReprs, pFlopTypes[3] = {0};
    int nFlopsNew, nFlops;
    assert( Gia_ManRegNum(p) == 0 );
    assert( p->pAigExtra != NULL );
    // consider seq synthesis with multiple clock domains
    if ( pParsC == NULL && Gia_ManClockDomainNum(p) > 1 )
        return Gia_ManSweepWithBoxesAndDomains( p, pParsS, fConst, fEquiv, fVerbose, fVerbEquivs );
    // order AIG objects
    pNew = Gia_ManDupUnnormalize( p );
    if ( pNew == NULL )
        return NULL;
    Gia_ManTransferTiming( pNew, p );
    nFlops = Vec_IntCountEntry(pNew->vRegClasses, 1);
    // find global equivalences
    pClp = Gia_ManDupCollapse( pNew, pNew->pAigExtra, NULL, pParsC ? 0 : 1 );
    //Gia_DumpAiger( pClp, p->pSpec, 1, 1 );
    // compute equivalences
    if ( pParsC )
        Gia_ManFraigSweepPerform( pClp, pParsC );
    else if ( pParsS )
        Cec_ManLSCorrespondenceClasses( pClp, (Cec_ParCor_t *)pParsS );
    else 
        Gia_ManSeqCleanupClasses( pClp, fConst, fEquiv, fVerbose );
    // transfer equivalences
    pReprs = Gia_ManFraigSelectReprs( pNew, pClp, fVerbose, pFlopTypes );
    Gia_ManStop( pClp );
    // reduce AIG
    Gia_ManTransferTiming( p, pNew );
    pNew = Gia_ManFraigReduceGia( pTemp = pNew, pReprs );
    Gia_ManTransferTiming( pNew, p );
    Gia_ManStop( pTemp );
    ABC_FREE( pReprs );
    // derive new AIG
    pNew = Gia_ManDupWithBoxes( pTemp = pNew, pParsC ? 0 : 1 );
    Gia_ManStop( pTemp );
    // report
    nFlopsNew = Vec_IntCountEntry(pNew->vRegClasses, 1);
    pFlopTypes[2] = nFlops - nFlopsNew - (pFlopTypes[0] + pFlopTypes[1]);
    if ( fVerbEquivs )
    {
        printf( "Domain %2d : %5d -> %5d :  ", 1, nFlops, nFlopsNew );
        printf( "EqConst =%4d.  EqFlop =%4d.  Dangling =%4d.  Unused =%4d.\n", 
            pFlopTypes[0], pFlopTypes[1], Abc_MaxInt(0, pFlopTypes[2]), Abc_MaxInt(0, -pFlopTypes[2]) );
    }
    // normalize the result
    pNew = Gia_ManDupNormalize( pTemp = pNew, 0 );
    Gia_ManTransferTiming( pNew, pTemp );
    Gia_ManStop( pTemp );
    // check integrity
    //Gia_ManCheckIntegrityWithBoxes( pNew );
    return pNew;
}